

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeNewRowid(Rtree *pRtree,i64 *piRowid)

{
  Vdbe *pVVar1;
  sqlite3_mutex *psVar2;
  int iVar3;
  Vdbe *p;
  
  pVVar1 = (Vdbe *)pRtree->pWriteRowid;
  iVar3 = vdbeUnbind(pVVar1,0);
  if ((iVar3 == 0) && (psVar2 = pVVar1->db->mutex, psVar2 != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  pVVar1 = (Vdbe *)pRtree->pWriteRowid;
  iVar3 = vdbeUnbind(pVVar1,1);
  if ((iVar3 == 0) && (psVar2 = pVVar1->db->mutex, psVar2 != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  sqlite3_step(pRtree->pWriteRowid);
  iVar3 = sqlite3_reset(pRtree->pWriteRowid);
  *piRowid = pRtree->db->lastRowid;
  return iVar3;
}

Assistant:

static int rtreeNewRowid(Rtree *pRtree, i64 *piRowid){
  int rc;
  sqlite3_bind_null(pRtree->pWriteRowid, 1);
  sqlite3_bind_null(pRtree->pWriteRowid, 2);
  sqlite3_step(pRtree->pWriteRowid);
  rc = sqlite3_reset(pRtree->pWriteRowid);
  *piRowid = sqlite3_last_insert_rowid(pRtree->db);
  return rc;
}